

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.h
# Opt level: O1

void __thiscall
cfd::api::json::ElementsDecodeRawTransactionTxOut::ElementsDecodeRawTransactionTxOut
          (ElementsDecodeRawTransactionTxOut *this)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_JsonClassBase<cfd::api::json::ElementsDecodeRawTransactionTxOut>)._vptr_JsonClassBase
       = (_func_int **)&PTR__ElementsDecodeRawTransactionTxOut_007426e0;
  p_Var1 = &(this->ignore_items)._M_t._M_impl.super__Rb_tree_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->value_ = 0;
  this->value_minimum_ = 0;
  this->value_maximum_ = 0;
  this->ct_exponent_ = 0;
  this->ct_bits_ = 0;
  (this->surjectionproof_)._M_dataplus._M_p = (pointer)&(this->surjectionproof_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->surjectionproof_,"");
  (this->valuecommitment_)._M_dataplus._M_p = (pointer)&(this->valuecommitment_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->valuecommitment_,"");
  (this->asset_)._M_dataplus._M_p = (pointer)&(this->asset_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->asset_,"");
  (this->assetcommitment_)._M_dataplus._M_p = (pointer)&(this->assetcommitment_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->assetcommitment_,"");
  (this->commitmentnonce_)._M_dataplus._M_p = (pointer)&(this->commitmentnonce_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->commitmentnonce_,"");
  this->commitmentnonce_fully_valid_ = false;
  this->n_ = 0;
  ElementsDecodeLockingScript::ElementsDecodeLockingScript(&this->script_pub_key_);
  (this->rangeproof_)._M_dataplus._M_p = (pointer)&(this->rangeproof_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->rangeproof_,"");
  CollectFieldName();
  return;
}

Assistant:

ElementsDecodeRawTransactionTxOut() {
    CollectFieldName();
  }